

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ddstexture.cpp
# Opt level: O0

int __thiscall
FDDSTexture::CopyTrueColorPixels
          (FDDSTexture *this,FBitmap *bmp,int x,int y,int rotate,FCopyInfo *inf)

{
  ushort uVar1;
  undefined4 local_f8 [2];
  int local_f0;
  int local_e8;
  undefined4 local_e0;
  FResourceLump *local_d8;
  undefined4 local_d0;
  undefined4 local_c8;
  undefined4 local_c0;
  BYTE *local_b0;
  undefined1 *local_a8;
  FDDSTexture *local_a0;
  BYTE *local_98;
  BYTE *local_80;
  BYTE *TexBuffer;
  FWadLump lump;
  FCopyInfo *inf_local;
  int rotate_local;
  int y_local;
  int x_local;
  FBitmap *bmp_local;
  FDDSTexture *this_local;
  
  local_a0 = this;
  lump.Lump = (FResourceLump *)inf;
  FWadCollection::OpenLumpNum((FWadLump *)&TexBuffer,&Wads,(this->super_FTexture).SourceLump);
  local_98 = (BYTE *)operator_new__((long)(int)((uint)(local_a0->super_FTexture).Width *
                                                (uint)(local_a0->super_FTexture).Height * 4));
  local_80 = local_98;
  FWadLump::Seek((FWadLump *)&TexBuffer,0x80,0);
  if ((local_a0->Format == 0) || (4 < local_a0->Format)) {
    if (local_a0->Format == 0x31545844) {
      DecompressDXT1(local_a0,(FWadLump *)&TexBuffer,local_80);
    }
    else if ((local_a0->Format == 0x33545844) || (local_a0->Format == 0x32545844)) {
      DecompressDXT3(local_a0,(FWadLump *)&TexBuffer,local_a0->Format == 0x32545844,local_80);
    }
    else if ((local_a0->Format == 0x35545844) || (local_a0->Format == 0x34545844)) {
      DecompressDXT5(local_a0,(FWadLump *)&TexBuffer,local_a0->Format == 0x34545844,local_80);
    }
  }
  else {
    ReadRGB(local_a0,(FWadLump *)&TexBuffer,local_80);
  }
  uVar1 = (local_a0->super_FTexture).Width;
  local_f0 = (uint)uVar1 << 2;
  local_d8 = lump.Lump;
  local_c0 = 0;
  local_c8 = 0;
  local_d0 = 0;
  local_e0 = 2;
  local_f8[0] = 4;
  local_e8 = rotate;
  local_a8 = (undefined1 *)local_f8;
  (*bmp->_vptr_FBitmap[2])
            (bmp,(ulong)(uint)x,(ulong)(uint)y,local_80,(ulong)uVar1,
             (ulong)(local_a0->super_FTexture).Height);
  local_b0 = local_80;
  if (local_80 != (BYTE *)0x0) {
    operator_delete__(local_80);
  }
  FWadLump::~FWadLump((FWadLump *)&TexBuffer);
  return -1;
}

Assistant:

int FDDSTexture::CopyTrueColorPixels(FBitmap *bmp, int x, int y, int rotate, FCopyInfo *inf)
{
	FWadLump lump = Wads.OpenLumpNum (SourceLump);

	BYTE *TexBuffer = new BYTE[4*Width*Height];

	lump.Seek (sizeof(DDSURFACEDESC2) + 4, SEEK_SET);

	if (Format >= 1 && Format <= 4)		// RGB: Format is # of bytes per pixel
	{
		ReadRGB (lump, TexBuffer);
	}
	else if (Format == ID_DXT1)
	{
		DecompressDXT1 (lump, TexBuffer);
	}
	else if (Format == ID_DXT3 || Format == ID_DXT2)
	{
		DecompressDXT3 (lump, Format == ID_DXT2, TexBuffer);
	}
	else if (Format == ID_DXT5 || Format == ID_DXT4)
	{
		DecompressDXT5 (lump, Format == ID_DXT4, TexBuffer);
	}

	// All formats decompress to RGBA.
	bmp->CopyPixelDataRGB(x, y, TexBuffer, Width, Height, 4, Width*4, rotate, CF_RGBA, inf);
	delete [] TexBuffer;
	return -1;
}